

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_node __thiscall pugi::xpath_query::evaluate_node(xpath_query *this,xpath_node *n)

{
  xpath_ast_node *this_00;
  xpath_node local_20c8;
  xpath_node_set_raw r;
  xpath_context c;
  xpath_stack_data sd;
  
  if (((undefined8 *)this->_impl == (undefined8 *)0x0) ||
     (this_00 = *this->_impl, this_00->_rettype != '\x01')) {
    xpath_node::xpath_node(&local_20c8);
  }
  else {
    c.n._node._root = (n->_node)._root;
    c.n._attribute._attr = (n->_attribute)._attr;
    sd.result._error = &sd.oom;
    sd.result._root = sd.blocks;
    sd.result._root_size = 0;
    sd.stack.temp = &sd.temp;
    sd.temp._root = sd.blocks + 1;
    sd.temp._root_size = 0;
    sd.oom = false;
    sd.blocks[1].next = (xpath_memory_block *)0x0;
    c.position = 1;
    sd.blocks[0].next = (xpath_memory_block *)0x0;
    c.size = 1;
    sd.stack.result = &sd.result;
    sd.blocks[1].capacity = 0x1000;
    sd.blocks[0].capacity = 0x1000;
    sd.temp._error = sd.result._error;
    impl::anon_unknown_0::xpath_ast_node::eval_node_set(&r,this_00,&c,&sd.stack,nodeset_eval_first);
    if (sd.oom == true) {
      xpath_node::xpath_node(&local_20c8);
    }
    else {
      local_20c8 = impl::anon_unknown_0::xpath_node_set_raw::first(&r);
    }
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(&sd);
  }
  return local_20c8;
}

Assistant:

PUGI_IMPL_FN xpath_node xpath_query::evaluate_node(const xpath_node& n) const
	{
		impl::xpath_ast_node* root = impl::evaluate_node_set_prepare(static_cast<impl::xpath_query_impl*>(_impl));
		if (!root) return xpath_node();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_node_set_raw r = root->eval_node_set(c, sd.stack, impl::nodeset_eval_first);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return xpath_node();
		#else
			throw std::bad_alloc();
		#endif
		}

		return r.first();
	}